

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

SrcList * sqlite3SrcListAppendList(Parse *pParse,SrcList *p1,SrcList *p2)

{
  SrcList *pNew;
  SrcList *p2_local;
  SrcList *p1_local;
  Parse *pParse_local;
  
  p2_local = p1;
  if (p2 != (SrcList *)0x0) {
    p2_local = sqlite3SrcListEnlarge(pParse,p1,p2->nSrc,1);
    if (p2_local == (SrcList *)0x0) {
      sqlite3SrcListDelete(pParse->db,p2);
      p2_local = p1;
    }
    else {
      memcpy(p2_local + 1,p2->a,(long)p2->nSrc * 0x68);
      sqlite3DbFree(pParse->db,p2);
      p2_local->a[0].fg.jointype =
           p2_local->a[0].fg.jointype | (byte)p2_local[1].a[0].regReturn & 0x40;
    }
  }
  return p2_local;
}

Assistant:

SQLITE_PRIVATE SrcList *sqlite3SrcListAppendList(Parse *pParse, SrcList *p1, SrcList *p2){
  assert( p1 && p1->nSrc==1 );
  if( p2 ){
    SrcList *pNew = sqlite3SrcListEnlarge(pParse, p1, p2->nSrc, 1);
    if( pNew==0 ){
      sqlite3SrcListDelete(pParse->db, p2);
    }else{
      p1 = pNew;
      memcpy(&p1->a[1], p2->a, p2->nSrc*sizeof(SrcItem));
      sqlite3DbFree(pParse->db, p2);
      p1->a[0].fg.jointype |= (JT_LTORJ & p1->a[1].fg.jointype);
    }
  }
  return p1;
}